

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableRead.cpp
# Opt level: O1

void __thiscall
ninx::parser::element::VariableRead::VariableRead(VariableRead *this,string *name,int suffix_spaces)

{
  pointer pcVar1;
  
  (this->super_Expression).super_Statement.super_ASTElement.parent = (Block *)0x0;
  (this->super_Expression).super_Statement.super_ASTElement.__output_block = (Block *)0x0;
  (this->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement =
       (_func_int **)&PTR__VariableRead_00150288;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  this->trailing_spaces = suffix_spaces;
  return;
}

Assistant:

ninx::parser::element::VariableRead::VariableRead(const std::string &name, int suffix_spaces)
        : name(name), trailing_spaces(suffix_spaces) {}